

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event_loop.cpp
# Opt level: O2

void __thiscall
cppurses::detail::Timer_event_loop::register_widget(Timer_event_loop *this,Widget *w)

{
  Signal<void_(cppurses::Widget_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(cppurses::Widget_&)>,_std::mutex>
  SStack_68;
  Slot<void_(cppurses::Widget_&),_std::function<void_(cppurses::Widget_&)>_> local_58;
  
  local_58.super_Slot_base._vptr_Slot_base = (_func_int **)w;
  std::
  _Rb_tree<cppurses::Widget*,cppurses::Widget*,std::_Identity<cppurses::Widget*>,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
  ::_M_emplace_unique<cppurses::Widget*>
            ((_Rb_tree<cppurses::Widget*,cppurses::Widget*,std::_Identity<cppurses::Widget*>,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
              *)&this->registered_widgets_,(Widget **)&local_58);
  local_58.super_Slot_base.tracked_ptrs_.
  super__Vector_base<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super_Slot_base.tracked_ptrs_.
  super__Vector_base<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super_Slot_base.tracked_ptrs_.
  super__Vector_base<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super_Slot_base._vptr_Slot_base = (_func_int **)&PTR__Slot_0017c5a0;
  local_58.function_.super__Function_base._M_functor._8_8_ = 0;
  local_58.function_._M_invoker =
       std::
       _Function_handler<void_(cppurses::Widget_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/uspasojevic96[P]markdown-notes/external/CPPurses/src/system/timer_event_loop.cpp:22:25)>
       ::_M_invoke;
  local_58.function_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cppurses::Widget_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/uspasojevic96[P]markdown-notes/external/CPPurses/src/system/timer_event_loop.cpp:22:25)>
       ::_M_manager;
  local_58.function_.super__Function_base._M_functor._M_unused._M_object = this;
  sig::
  Signal<void_(cppurses::Widget_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(cppurses::Widget_&)>,_std::mutex>
  ::connect(&SStack_68,(int)w + 0x268,(sockaddr *)&local_58,1);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
             &SStack_68.pimpl_.
              super___shared_ptr<sig::Signal_impl<void_(cppurses::Widget_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(cppurses::Widget_&)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  sig::Slot<void_(cppurses::Widget_&),_std::function<void_(cppurses::Widget_&)>_>::~Slot(&local_58);
  return;
}

Assistant:

void Timer_event_loop::register_widget(Widget& w)
{
    registered_widgets_.emplace(&w);
    w.destroyed.connect([this](Widget& d) { registered_widgets_.erase(&d); });
}